

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

time_t __thiscall QFileSystemModelPrivate::time(QFileSystemModelPrivate *this,time_t *__timer)

{
  time_t *ptVar1;
  uint *in_RDX;
  time_t *ptVar2;
  long in_FS_OFFSET;
  Data local_38;
  QDateTime local_30 [8];
  QLocale local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((int)*in_RDX < 0) || ((int)in_RDX[1] < 0)) || (*(long *)(in_RDX + 4) == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_00621127;
    *(undefined8 *)this = 0;
    *(undefined8 *)&this->field_0x8 = 0;
    *(undefined8 *)&this->field_0x10 = 0;
  }
  else {
    QLocale::system();
    ptVar1 = __timer + 0x27;
    if (*(long *)(in_RDX + 4) != 0) {
      ptVar1 = *(time_t **)(in_RDX + 2);
    }
    ptVar2 = __timer + 0x27;
    if (-1 < (int)(in_RDX[1] | *in_RDX)) {
      ptVar2 = ptVar1;
    }
    local_38 = (Data)0x1;
    if (ptVar2[7] == 0) {
      QDateTime::QDateTime(local_30);
    }
    else {
      QFileInfo::fileTime((FileTime)local_30,(QTimeZone *)(ptVar2[7] + 0x20));
    }
    QLocale::toString((QDateTime *)this,(FormatType)local_28);
    QDateTime::~QDateTime(local_30);
    QTimeZone::~QTimeZone((QTimeZone *)&local_38.s);
    QLocale::~QLocale(local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_00621127:
      __stack_chk_fail();
    }
  }
  return (time_t)this;
}

Assistant:

QString QFileSystemModelPrivate::time(const QModelIndex &index) const
{
    if (!index.isValid())
        return QString();
#if QT_CONFIG(datestring)
    return QLocale::system().toString(node(index)->lastModified(QTimeZone::LocalTime), QLocale::ShortFormat);
#else
    Q_UNUSED(index);
    return QString();
#endif
}